

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

FunctionRuntimeType<(density::function_type_erasure)0,_int_()> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::complete_type(consume_operation *this)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_()> *pFVar2;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,1000);
  }
  pFVar2 = detail::
           LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::type_after_control((ControlBlock *)(this->m_consume_data).m_control);
  return pFVar2;
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *Base::type_after_control(m_consume_data.m_control);
            }